

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_c.cpp
# Opt level: O0

void spvc_msl_shader_interface_var_init(spvc_msl_shader_interface_var *var)

{
  undefined1 local_28 [8];
  MSLShaderInterfaceVariable var_default;
  spvc_msl_shader_interface_var *var_local;
  
  var_default._16_8_ = var;
  spirv_cross::MSLShaderInterfaceVariable::MSLShaderInterfaceVariable
            ((MSLShaderInterfaceVariable *)local_28);
  *(undefined4 *)var_default._16_8_ = local_28._0_4_;
  *(uint32_t *)(var_default._16_8_ + 4) = var_default.location;
  *(uint32_t *)(var_default._16_8_ + 8) = var_default.component;
  *(MSLShaderVariableFormat *)(var_default._16_8_ + 0xc) = var_default.format;
  return;
}

Assistant:

void spvc_msl_shader_interface_var_init(spvc_msl_shader_interface_var *var)
{
#if SPIRV_CROSS_C_API_MSL
	MSLShaderInterfaceVariable var_default;
	var->location = var_default.location;
	var->format = static_cast<spvc_msl_shader_variable_format>(var_default.format);
	var->builtin = static_cast<SpvBuiltIn>(var_default.builtin);
	var->vecsize = var_default.vecsize;
#else
	memset(var, 0, sizeof(*var));
#endif
}